

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbg.cc
# Opt level: O2

void anon_unknown.dwarf_4948::PrintUsage(ostream *stream)

{
  long lVar1;
  ostream *poVar2;
  
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream," lbg - Linde-Buzo-Gray algorithm for vector quantizer design");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream,"  usage:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       lbg [ options ] [ infile ] > stdout");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  options:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -l l  : length of vector               (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x1a);
  poVar2 = std::operator<<(poVar2,"][   1 <= l <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -m m  : order of vector                (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::operator<<(poVar2,"l-1");
  poVar2 = std::operator<<(poVar2,"][   0 <= m <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -s s  : seed                           (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  poVar2 = std::operator<<(poVar2,"][     <= s <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -e e  : target codebook size           (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x100);
  poVar2 = std::operator<<(poVar2,"][   2 <= e <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -C C  : input filename of double type  (string)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::operator<<(poVar2,"N/A");
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"               initial codebook");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -I I  : output filename of int type    (string)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::operator<<(poVar2,"N/A");
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"               codebook index");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -S S  : output filename of double type (string)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::operator<<(poVar2,"N/A");
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"               total distance");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -h    : print this message");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"     (level 2)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -n n  : minimum number of vectors in   (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1);
  poVar2 = std::operator<<(poVar2,"][   1 <= n <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"               a cluster");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -i i  : maximum number of iterations   (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,1000);
  poVar2 = std::operator<<(poVar2,"][   1 <= i <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -d d  : convergence threshold          (double)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::ostream::_M_insert<double>(1e-05);
  poVar2 = std::operator<<(poVar2,"][ 0.0 <= d <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -r r  : splitting factor               (double)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::ostream::_M_insert<double>(1e-05);
  poVar2 = std::operator<<(poVar2,"][ 0.0 <  r <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  infile:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       vectors                                (double)[stdin]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  stdout:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       codebook                               (double)");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  notice:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,
                           "       number of input vectors must be equal to or greater than n * e");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,
                           "       final codebook size may not be e because codebook size is always doubled"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream," SPTK: version ");
  poVar2 = std::operator<<(poVar2,"4.3");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " lbg - Linde-Buzo-Gray algorithm for vector quantizer design" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       lbg [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -l l  : length of vector               (   int)[" << std::setw(5) << std::right << kDefaultNumOrder + 1          << "][   1 <= l <=   ]" << std::endl;  // NOLINT
  *stream << "       -m m  : order of vector                (   int)[" << std::setw(5) << std::right << "l-1"                         << "][   0 <= m <=   ]" << std::endl;  // NOLINT
  *stream << "       -s s  : seed                           (   int)[" << std::setw(5) << std::right << kDefaultSeed                  << "][     <= s <=   ]" << std::endl;  // NOLINT
  *stream << "       -e e  : target codebook size           (   int)[" << std::setw(5) << std::right << kDefaultTargetCodebookSize    << "][   2 <= e <=   ]" << std::endl;  // NOLINT
  *stream << "       -C C  : input filename of double type  (string)[" << std::setw(5) << std::right << "N/A"                         << "]" << std::endl;  // NOLINT
  *stream << "               initial codebook" << std::endl;
  *stream << "       -I I  : output filename of int type    (string)[" << std::setw(5) << std::right << "N/A"                         << "]" << std::endl;  // NOLINT
  *stream << "               codebook index" << std::endl;
  *stream << "       -S S  : output filename of double type (string)[" << std::setw(5) << std::right << "N/A"                         << "]" << std::endl;  // NOLINT
  *stream << "               total distance" << std::endl;
  *stream << "       -h    : print this message" << std::endl;
  *stream << "     (level 2)" << std::endl;
  *stream << "       -n n  : minimum number of vectors in   (   int)[" << std::setw(5) << std::right << kDefaultMinNumVectorInCluster << "][   1 <= n <=   ]" << std::endl;  // NOLINT
  *stream << "               a cluster" << std::endl;
  *stream << "       -i i  : maximum number of iterations   (   int)[" << std::setw(5) << std::right << kDefaultNumIteration          << "][   1 <= i <=   ]" << std::endl;  // NOLINT
  *stream << "       -d d  : convergence threshold          (double)[" << std::setw(5) << std::right << kDefaultConvergenceThreshold  << "][ 0.0 <= d <=   ]" << std::endl;  // NOLINT
  *stream << "       -r r  : splitting factor               (double)[" << std::setw(5) << std::right << kDefaultSplittingFactor       << "][ 0.0 <  r <=   ]" << std::endl;  // NOLINT
  *stream << "  infile:" << std::endl;
  *stream << "       vectors                                (double)[stdin]" << std::endl;  // NOLINT
  *stream << "  stdout:" << std::endl;
  *stream << "       codebook                               (double)" << std::endl;  // NOLINT
  *stream << "  notice:" << std::endl;
  *stream << "       number of input vectors must be equal to or greater than n * e" << std::endl;  // NOLINT
  *stream << "       final codebook size may not be e because codebook size is always doubled" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}